

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpStateFront,VkStencilOpState *stencilOpStateBack)

{
  ostream *poVar1;
  ostringstream desc;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,"\nFront faces:\n");
  ::vk::operator<<(poVar1,(VkStencilOpState *)this);
  poVar1 = std::operator<<((ostream *)aoStack_198,"Back faces:\n");
  ::vk::operator<<(poVar1,stencilOpStateFront);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string getStencilStateSetDescription(const VkStencilOpState& stencilOpStateFront,
										  const VkStencilOpState& stencilOpStateBack)
{
	std::ostringstream desc;

	desc << "\nFront faces:\n" << stencilOpStateFront;
	desc << "Back faces:\n" << stencilOpStateBack;

	return desc.str();
}